

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O1

int MPIABI_Comm_spawn_multiple
              (int count,char **array_of_commands,char ***array_of_argv,int *array_of_maxprocs,
              MPIABI_Info *array_of_info,int root,MPIABI_Comm comm,MPIABI_Comm *intercomm,
              int *array_of_errcodes)

{
  int iVar1;
  
  iVar1 = MPI_Comm_spawn_multiple();
  return iVar1;
}

Assistant:

int MPIABI_Comm_spawn_multiple(
    int count, char *array_of_commands[], char **array_of_argv[],
    const int array_of_maxprocs[], const MPIABI_Info array_of_info[], int root,
    MPIABI_Comm comm, MPIABI_Comm *intercomm, int array_of_errcodes[]) {
  if (sizeof(MPI_Info) == sizeof(MPIABI_Info))
    return MPI_Comm_spawn_multiple(
        count, array_of_commands, array_of_argv, array_of_maxprocs,
        (const MPI_Info *)array_of_info, root, (MPI_Comm)comm,
        (MPI_Comm *)intercomm, array_of_errcodes);
  std::vector<MPI_Info> infos(count);
  for (int i = 0; i < count; ++i)
    infos[i] = (WPI_Info)array_of_info[i];
  const int ierr = MPI_Comm_spawn_multiple(
      count, array_of_commands, array_of_argv, array_of_maxprocs, infos.data(),
      root, (WPI_Comm)comm, (WPI_CommPtr)intercomm, array_of_errcodes);
  return ierr;
}